

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

void capnp::_::anon_unknown_133::
     genericCheckTestMessage<capnproto_test::capnp::test::TestAllTypes::Builder>(Builder reader)

{
  float fVar1;
  byte bVar2;
  char cVar3;
  short sVar4;
  Builder reader_00;
  Builder reader_01;
  Builder reader_02;
  Builder reader_03;
  Builder reader_04;
  Builder reader_05;
  Builder reader_06;
  Builder reader_07;
  Builder reader_08;
  Builder reader_09;
  Builder reader_10;
  Builder reader_11;
  Builder reader_12;
  Builder reader_13;
  Builder reader_14;
  Builder reader_15;
  Builder reader_16;
  Builder reader_17;
  Builder reader_18;
  Builder reader_19;
  Builder reader_20;
  Builder reader_21;
  Builder reader_22;
  Builder reader_23;
  Builder reader_24;
  Builder reader_25;
  Builder reader_26;
  undefined4 uVar5;
  ArrayPtr<unsigned_char> AVar6;
  CapTableBuilder *pCVar7;
  bool bVar8;
  float fVar9;
  double dVar10;
  WirePointer WVar11;
  double dVar12;
  float fVar13;
  SegmentBuilder *pSVar14;
  initializer_list<capnp::Void> expected;
  initializer_list<bool> expected_00;
  initializer_list<signed_char> expected_01;
  initializer_list<short> expected_02;
  initializer_list<int> expected_03;
  initializer_list<long> expected_04;
  initializer_list<unsigned_char> expected_05;
  initializer_list<unsigned_short> expected_06;
  initializer_list<unsigned_int> expected_07;
  initializer_list<unsigned_long> expected_08;
  initializer_list<float> expected_09;
  initializer_list<double> expected_10;
  initializer_list<capnp::Text::Reader> expected_11;
  initializer_list<capnp::Data::Reader> expected_12;
  initializer_list<capnp::schemas::TestEnum_9c8e9318b29d9cd3> expected_13;
  initializer_list<bool> expected_14;
  initializer_list<signed_char> expected_15;
  initializer_list<short> expected_16;
  initializer_list<int> expected_17;
  initializer_list<long> expected_18;
  initializer_list<unsigned_char> expected_19;
  initializer_list<unsigned_short> expected_20;
  initializer_list<unsigned_int> expected_21;
  initializer_list<unsigned_long> expected_22;
  initializer_list<capnp::Text::Reader> expected_23;
  initializer_list<capnp::Data::Reader> expected_24;
  initializer_list<capnp::schemas::TestEnum_9c8e9318b29d9cd3> expected_25;
  SegmentBuilder *in_stack_00000008;
  undefined8 in_stack_00000010;
  byte *in_stack_00000018;
  WirePointer *in_stack_00000020;
  DebugComparison<bool,_bool> _kjCondition;
  Builder subReader;
  DebugExpression<bool> _kjCondition_9;
  DebugExpression<bool> _kjCondition_22;
  undefined1 local_548 [24];
  size_t sStack_530;
  char *local_528;
  size_t sStack_520;
  bool local_518;
  undefined1 local_510 [8];
  WirePointer WStack_508;
  WirePointer *local_500;
  WirePointer *local_4f8;
  bool local_4f0;
  ListBuilder local_4e8;
  StructBuilder local_4c0;
  PointerBuilder local_498;
  Builder local_480;
  ListBuilder local_468;
  ListBuilder local_440;
  ListBuilder local_418;
  ListBuilder local_3f0;
  ListBuilder local_3c8;
  ListBuilder local_3a0;
  ListBuilder local_378;
  ListBuilder local_350;
  ListBuilder local_328;
  ListBuilder local_300;
  ListBuilder local_2d8;
  ListBuilder local_2b0;
  ListBuilder local_288;
  ListBuilder local_260;
  ListBuilder local_238;
  ListBuilder local_210;
  ListBuilder local_1e8;
  ListBuilder local_1c0;
  ListBuilder local_198;
  ListBuilder local_170;
  ListBuilder local_148;
  ListBuilder local_120;
  ListBuilder local_f8;
  ListBuilder local_d0;
  ListBuilder local_a8;
  ListBuilder local_80;
  ListBuilder local_58;
  
  bVar2 = *in_stack_00000018;
  local_548._0_8_ = CONCAT62(local_548._2_6_,CONCAT11(bVar2,1)) & 0xffffffffffff01ff;
  local_548._8_8_ = " == ";
  local_548._16_8_ = &DAT_00000005;
  sStack_530 = CONCAT71(sStack_530._1_7_,bVar2) & 0xffffffffffffff01;
  if (((bVar2 & 1) == 0) && (kj::_::Debug::minSeverity < 3)) {
    local_510[0] = 1;
    local_4e8.segment._0_1_ = *in_stack_00000018 & 1;
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<bool,bool>&,bool,bool>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xdc,ERROR,
               "\"failed: expected \" \"(true) == (reader.getBoolField())\", _kjCondition, true, reader.getBoolField()"
               ,(char (*) [51])"failed: expected (true) == (reader.getBoolField())",
               (DebugComparison<bool,_bool> *)local_548,(bool *)local_510,(bool *)&local_4e8);
  }
  bVar2 = in_stack_00000018[1];
  local_548[4] = bVar2;
  local_548._0_4_ = 0xffffff85;
  local_548._8_8_ = " == ";
  local_548._16_8_ = &DAT_00000005;
  if ((bVar2 != 0x85) && (kj::_::Debug::minSeverity < 3)) {
    local_510._0_4_ = 0xffffff85;
    local_4e8.segment._0_1_ = in_stack_00000018[1];
    sStack_530._0_1_ = bVar2 == 0x85;
    kj::_::Debug::log<char_const(&)[51],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xdd,ERROR,
               "\"failed: expected \" \"(-123) == (reader.getInt8Field())\", _kjCondition, -123, reader.getInt8Field()"
               ,(char (*) [51])"failed: expected (-123) == (reader.getInt8Field())",
               (DebugComparison<int,_signed_char> *)local_548,(int *)local_510,(char *)&local_4e8);
  }
  local_548._4_2_ = *(short *)(in_stack_00000018 + 2);
  local_548._0_4_ = 0xffffcfc7;
  local_548._8_8_ = " == ";
  local_548._16_8_ = &DAT_00000005;
  sStack_530._0_1_ = *(short *)(in_stack_00000018 + 2) == -0x3039;
  if ((!sStack_530._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    local_510._0_4_ = 0xffffcfc7;
    local_4e8.segment._0_2_ = *(undefined2 *)(in_stack_00000018 + 2);
    kj::_::Debug::log<char_const(&)[54],kj::_::DebugComparison<int,short>&,int,short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xde,ERROR,
               "\"failed: expected \" \"(-12345) == (reader.getInt16Field())\", _kjCondition, -12345, reader.getInt16Field()"
               ,(char (*) [54])"failed: expected (-12345) == (reader.getInt16Field())",
               (DebugComparison<int,_short> *)local_548,(int *)local_510,(short *)&local_4e8);
  }
  local_548._4_4_ = *(undefined4 *)(in_stack_00000018 + 4);
  local_548._0_4_ = 0xff439eb2;
  local_548._8_8_ = " == ";
  local_548._16_8_ = &DAT_00000005;
  sStack_530 = CONCAT71(sStack_530._1_7_,local_548._4_4_ == -0xbc614e);
  if ((local_548._4_4_ != -0xbc614e) && (kj::_::Debug::minSeverity < 3)) {
    local_510._0_4_ = 0xff439eb2;
    local_4e8.segment._0_4_ = *(undefined4 *)(in_stack_00000018 + 4);
    kj::_::Debug::log<char_const(&)[57],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xdf,ERROR,
               "\"failed: expected \" \"(-12345678) == (reader.getInt32Field())\", _kjCondition, -12345678, reader.getInt32Field()"
               ,(char (*) [57])"failed: expected (-12345678) == (reader.getInt32Field())",
               (DebugComparison<int,_int> *)local_548,(int *)local_510,(int *)&local_4e8);
  }
  local_548._8_8_ = *(undefined8 *)(in_stack_00000018 + 8);
  local_548._0_8_ = (SegmentBuilder *)0xffff8fb779f22087;
  local_548._16_8_ = " == ";
  sStack_530 = 5;
  local_528 = (char *)CONCAT71(local_528._1_7_,
                               (CapTableBuilder *)local_548._8_8_ ==
                               (CapTableBuilder *)0xffff8fb779f22087);
  if (((CapTableBuilder *)local_548._8_8_ != (CapTableBuilder *)0xffff8fb779f22087) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_510 = (undefined1  [8])0xffff8fb779f22087;
    local_4e8.segment = (SegmentBuilder *)*(undefined8 *)(in_stack_00000018 + 8);
    kj::_::Debug::log<char_const(&)[66],kj::_::DebugComparison<long_long,long>&,long_long,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xe0,ERROR,
               "\"failed: expected \" \"(-123456789012345ll) == (reader.getInt64Field())\", _kjCondition, -123456789012345ll, reader.getInt64Field()"
               ,(char (*) [66])"failed: expected (-123456789012345ll) == (reader.getInt64Field())",
               (DebugComparison<long_long,_long> *)local_548,(longlong *)local_510,
               (long *)&local_4e8);
  }
  bVar2 = in_stack_00000018[0x10];
  local_548[4] = bVar2;
  local_548._0_4_ = 0xea;
  local_548._8_8_ = " == ";
  local_548._16_8_ = &DAT_00000005;
  if ((bVar2 != 0xea) && (kj::_::Debug::minSeverity < 3)) {
    local_510._0_4_ = 0xea;
    local_4e8.segment._0_1_ = in_stack_00000018[0x10];
    sStack_530._0_1_ = bVar2 == 0xea;
    kj::_::Debug::
    log<char_const(&)[52],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xe1,ERROR,
               "\"failed: expected \" \"(234u) == (reader.getUInt8Field())\", _kjCondition, 234u, reader.getUInt8Field()"
               ,(char (*) [52])"failed: expected (234u) == (reader.getUInt8Field())",
               (DebugComparison<unsigned_int,_unsigned_char> *)local_548,(uint *)local_510,
               (uchar *)&local_4e8);
  }
  local_548._4_2_ = *(short *)(in_stack_00000018 + 0x12);
  local_548._0_4_ = 0xb26e;
  local_548._8_8_ = " == ";
  local_548._16_8_ = &DAT_00000005;
  sStack_530._0_1_ = *(short *)(in_stack_00000018 + 0x12) == -0x4d92;
  if ((!sStack_530._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    local_510._0_4_ = 0xb26e;
    local_4e8.segment._0_2_ = *(undefined2 *)(in_stack_00000018 + 0x12);
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xe2,ERROR,
               "\"failed: expected \" \"(45678u) == (reader.getUInt16Field())\", _kjCondition, 45678u, reader.getUInt16Field()"
               ,(char (*) [55])"failed: expected (45678u) == (reader.getUInt16Field())",
               (DebugComparison<unsigned_int,_unsigned_short> *)local_548,(uint *)local_510,
               (unsigned_short *)&local_4e8);
  }
  local_548._4_4_ = *(undefined4 *)(in_stack_00000018 + 0x14);
  local_548._0_4_ = 0xce0a6a14;
  local_548._8_8_ = " == ";
  local_548._16_8_ = &DAT_00000005;
  sStack_530 = CONCAT71(sStack_530._1_7_,local_548._4_4_ == -0x31f595ec);
  if ((local_548._4_4_ != -0x31f595ec) && (kj::_::Debug::minSeverity < 3)) {
    local_510._0_4_ = 0xce0a6a14;
    local_4e8.segment._0_4_ = *(undefined4 *)(in_stack_00000018 + 0x14);
    kj::_::Debug::
    log<char_const(&)[60],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xe3,ERROR,
               "\"failed: expected \" \"(3456789012u) == (reader.getUInt32Field())\", _kjCondition, 3456789012u, reader.getUInt32Field()"
               ,(char (*) [60])"failed: expected (3456789012u) == (reader.getUInt32Field())",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_548,(uint *)local_510,
               (uint *)&local_4e8);
  }
  local_548._8_8_ = *(undefined8 *)(in_stack_00000018 + 0x18);
  local_548._0_8_ = (SegmentBuilder *)0xab54a98ceb1f0ad2;
  local_548._16_8_ = " == ";
  sStack_530 = 5;
  local_528 = (char *)CONCAT71(local_528._1_7_,
                               (CapTableBuilder *)local_548._8_8_ ==
                               (CapTableBuilder *)0xab54a98ceb1f0ad2);
  if (((CapTableBuilder *)local_548._8_8_ != (CapTableBuilder *)0xab54a98ceb1f0ad2) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_510 = (undefined1  [8])0xab54a98ceb1f0ad2;
    local_4e8.segment = (SegmentBuilder *)*(undefined8 *)(in_stack_00000018 + 0x18);
    kj::_::Debug::
    log<char_const(&)[72],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xe4,ERROR,
               "\"failed: expected \" \"(12345678901234567890ull) == (reader.getUInt64Field())\", _kjCondition, 12345678901234567890ull, reader.getUInt64Field()"
               ,(char (*) [72])
                "failed: expected (12345678901234567890ull) == (reader.getUInt64Field())",
               (DebugComparison<unsigned_long_long,_unsigned_long> *)local_548,
               (unsigned_long_long *)local_510,(unsigned_long *)&local_4e8);
  }
  fVar1 = *(float *)(in_stack_00000018 + 0x20);
  if ((fVar1 != 1234.5) || (NAN(fVar1))) {
    fVar9 = fVar1 + -1234.5;
    fVar13 = -fVar9;
    if (-fVar9 <= fVar9) {
      fVar13 = fVar9;
    }
    fVar9 = -fVar1;
    if (-fVar1 <= fVar1) {
      fVar9 = fVar1;
    }
    fVar9 = (fVar9 + 1234.5) * 1e-05;
    local_4e8.segment._0_1_ = fVar13 < fVar9;
    if ((fVar9 <= fVar13) && (kj::_::Debug::minSeverity < 3)) {
      local_548._0_4_ = fVar1;
      local_510._0_4_ = 0x449a5000;
      kj::_::Debug::log<char_const(&)[78],kj::_::DebugExpression<bool>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe5,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.getFloat32Field(), 1234.5f)\", _kjCondition, reader.getFloat32Field(), 1234.5f"
                 ,(char (*) [78])
                  "failed: expected ::kj::_::floatAlmostEqual(reader.getFloat32Field(), 1234.5f)",
                 (DebugExpression<bool> *)&local_4e8,(float *)local_548,(float *)local_510);
    }
  }
  local_548._0_8_ = *(undefined8 *)(in_stack_00000018 + 0x28);
  pCVar7 = local_4e8.capTable;
  if (((double)local_548._0_8_ != -1.23e+47) || (NAN((double)local_548._0_8_))) {
    dVar10 = (double)local_548._0_8_ + 1.23e+47;
    dVar12 = -dVar10;
    if (-dVar10 <= dVar10) {
      dVar12 = dVar10;
    }
    pSVar14 = (SegmentBuilder *)-(double)local_548._0_8_;
    if (-(double)local_548._0_8_ <= (double)local_548._0_8_) {
      pSVar14 = (SegmentBuilder *)local_548._0_8_;
    }
    dVar10 = ((double)pSVar14 + 1.23e+47) * 1e-12;
    local_4e8.segment._0_1_ = dVar12 < dVar10;
    if ((dVar10 <= dVar12) && (kj::_::Debug::minSeverity < 3)) {
      local_510 = (undefined1  [8])0xc9b58b82c0e0bb00;
      kj::_::Debug::log<char_const(&)[79],kj::_::DebugExpression<bool>&,double,double>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xe6,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.getFloat64Field(), -123e45)\", _kjCondition, reader.getFloat64Field(), -123e45"
                 ,(char (*) [79])
                  "failed: expected ::kj::_::doubleAlmostEqual(reader.getFloat64Field(), -123e45)",
                 (DebugExpression<bool> *)&local_4e8,(double *)local_548,(double *)local_510);
      pCVar7 = local_4e8.capTable;
    }
  }
  local_4e8.capTable = pCVar7;
  local_4e8.segment = (SegmentBuilder *)"foo";
  local_548._16_8_ = in_stack_00000020;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)local_510,(PointerBuilder *)local_548,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_548,
             (DebugExpression<char_const(&)[4]> *)&local_4e8,(Builder *)local_510);
  if ((local_518 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_500 = in_stack_00000020;
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&local_4e8,(PointerBuilder *)local_510,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[52],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xe7,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (reader.getTextField())\", _kjCondition, \"foo\", reader.getTextField()"
               ,(char (*) [52])"failed: expected (\"foo\") == (reader.getTextField())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_548,
               (char (*) [4])"foo",(Builder *)&local_4e8);
  }
  WStack_508 = (WirePointer)0x3;
  local_510 = (undefined1  [8])"bar";
  local_548._16_8_ = in_stack_00000020 + 1;
  local_4e8._0_16_ = PointerBuilder::getBlob<capnp::Data>((PointerBuilder *)local_548,(void *)0x0,0)
  ;
  kj::_::DebugExpression<capnp::Data::Reader>::operator==
            ((DebugExpression<capnp::Data::Reader> *)local_510,(Builder *)&local_4e8);
  if ((local_518 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_4e8.capTable = (CapTableBuilder *)0x3;
    local_4e8.segment = (SegmentBuilder *)"bar";
    local_500 = in_stack_00000020 + 1;
    _local_510 = (ArrayPtr<unsigned_char>)
                 PointerBuilder::getBlob<capnp::Data>((PointerBuilder *)local_510,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[58],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Builder>&,capnp::Data::Reader,capnp::Data::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xe8,ERROR,
               "\"failed: expected \" \"(data(\\\"bar\\\")) == (reader.getDataField())\", _kjCondition, data(\"bar\"), reader.getDataField()"
               ,(char (*) [58])"failed: expected (data(\"bar\")) == (reader.getDataField())",
               (DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> *)local_548,
               (Reader *)&local_4e8,(Builder *)local_510);
  }
  local_548._16_8_ = in_stack_00000020 + 2;
  local_548._0_8_ = in_stack_00000008;
  PointerBuilder::getStruct
            ((StructBuilder *)local_510,(PointerBuilder *)local_548,(StructSize)0x140006,(word *)0x0
            );
  bVar2 = (byte)(local_500->offsetAndKind).value;
  local_548._0_8_ = CONCAT62(local_548._2_6_,CONCAT11(bVar2,1)) & 0xffffffffffff01ff;
  local_548._8_8_ = " == ";
  local_548._16_8_ = &DAT_00000005;
  sStack_530 = CONCAT71(sStack_530._1_7_,bVar2) & 0xffffffffffffff01;
  if (((bVar2 & 1) == 0) && (kj::_::Debug::minSeverity < 3)) {
    local_4e8.segment._0_1_ = 1;
    local_4c0.segment._0_1_ = (byte)(local_500->offsetAndKind).value & 1;
    kj::_::Debug::log<char_const(&)[54],kj::_::DebugComparison<bool,bool>&,bool,bool>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xec,ERROR,
               "\"failed: expected \" \"(true) == (subReader.getBoolField())\", _kjCondition, true, subReader.getBoolField()"
               ,(char (*) [54])"failed: expected (true) == (subReader.getBoolField())",
               (DebugComparison<bool,_bool> *)local_548,(bool *)&local_4e8,(bool *)&local_4c0);
  }
  cVar3 = *(char *)((long)&(local_500->offsetAndKind).value + 1);
  local_548[4] = cVar3;
  local_548._0_4_ = 0xfffffff4;
  local_548._8_8_ = " == ";
  local_548._16_8_ = &DAT_00000005;
  if ((cVar3 != -0xc) && (kj::_::Debug::minSeverity < 3)) {
    local_4e8.segment._0_4_ = 0xfffffff4;
    local_4c0.segment._0_1_ = *(char *)((long)&(local_500->offsetAndKind).value + 1);
    sStack_530._0_1_ = cVar3 == -0xc;
    kj::_::Debug::log<char_const(&)[53],kj::_::DebugComparison<int,signed_char>&,int,signed_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xed,ERROR,
               "\"failed: expected \" \"(-12) == (subReader.getInt8Field())\", _kjCondition, -12, subReader.getInt8Field()"
               ,(char (*) [53])"failed: expected (-12) == (subReader.getInt8Field())",
               (DebugComparison<int,_signed_char> *)local_548,(int *)&local_4e8,(char *)&local_4c0);
  }
  sVar4 = *(short *)((long)&(local_500->offsetAndKind).value + 2);
  local_548._4_2_ = sVar4;
  local_548._0_4_ = 0xd80;
  local_548._8_8_ = " == ";
  local_548._16_8_ = &DAT_00000005;
  sStack_530._0_1_ = sVar4 == 0xd80;
  if ((!sStack_530._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    local_4e8.segment._0_4_ = 0xd80;
    local_4c0.segment._0_2_ = *(undefined2 *)((long)&(local_500->offsetAndKind).value + 2);
    kj::_::Debug::log<char_const(&)[55],kj::_::DebugComparison<int,short>&,int,short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xee,ERROR,
               "\"failed: expected \" \"(3456) == (subReader.getInt16Field())\", _kjCondition, 3456, subReader.getInt16Field()"
               ,(char (*) [55])"failed: expected (3456) == (subReader.getInt16Field())",
               (DebugComparison<int,_short> *)local_548,(int *)&local_4e8,(short *)&local_4c0);
  }
  local_548._4_4_ = (local_500->field_1).upper32Bits;
  local_548._0_4_ = 0xfb4c100e;
  local_548._8_8_ = " == ";
  local_548._16_8_ = &DAT_00000005;
  sStack_530 = CONCAT71(sStack_530._1_7_,local_548._4_4_ == 0xfb4c100e);
  if ((local_548._4_4_ != 0xfb4c100e) && (kj::_::Debug::minSeverity < 3)) {
    local_4e8.segment._0_4_ = 0xfb4c100e;
    local_4c0.segment._0_4_ = (local_500->field_1).upper32Bits;
    kj::_::Debug::log<char_const(&)[60],kj::_::DebugComparison<int,int>&,int,int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xef,ERROR,
               "\"failed: expected \" \"(-78901234) == (subReader.getInt32Field())\", _kjCondition, -78901234, subReader.getInt32Field()"
               ,(char (*) [60])"failed: expected (-78901234) == (subReader.getInt32Field())",
               (DebugComparison<int,_int> *)local_548,(int *)&local_4e8,(int *)&local_4c0);
  }
  local_548._8_8_ = local_500[1];
  local_548._0_8_ = (SegmentBuilder *)0x33a638e8734e;
  local_548._16_8_ = " == ";
  sStack_530 = 5;
  local_528 = (char *)CONCAT71(local_528._1_7_,
                               (WirePointer)local_548._8_8_ == (WirePointer)0x33a638e8734e);
  if (((WirePointer)local_548._8_8_ != (WirePointer)0x33a638e8734e) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_4e8.segment = (SegmentBuilder *)0x33a638e8734e;
    local_4c0.segment = (SegmentBuilder *)local_500[1];
    kj::_::Debug::log<char_const(&)[67],kj::_::DebugComparison<long_long,long>&,long_long,long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xf0,ERROR,
               "\"failed: expected \" \"(56789012345678ll) == (subReader.getInt64Field())\", _kjCondition, 56789012345678ll, subReader.getInt64Field()"
               ,(char (*) [67])"failed: expected (56789012345678ll) == (subReader.getInt64Field())",
               (DebugComparison<long_long,_long> *)local_548,(longlong *)&local_4e8,
               (long *)&local_4c0);
  }
  cVar3 = (char)local_500[2].offsetAndKind.value;
  local_548[4] = cVar3;
  local_548._0_4_ = 0x5a;
  local_548._8_8_ = " == ";
  local_548._16_8_ = &DAT_00000005;
  if ((cVar3 != 'Z') && (kj::_::Debug::minSeverity < 3)) {
    local_4e8.segment._0_4_ = 0x5a;
    local_4c0.segment._0_1_ = (char)local_500[2].offsetAndKind.value;
    sStack_530._0_1_ = cVar3 == 'Z';
    kj::_::Debug::
    log<char_const(&)[54],kj::_::DebugComparison<unsigned_int,unsigned_char>&,unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xf1,ERROR,
               "\"failed: expected \" \"(90u) == (subReader.getUInt8Field())\", _kjCondition, 90u, subReader.getUInt8Field()"
               ,(char (*) [54])"failed: expected (90u) == (subReader.getUInt8Field())",
               (DebugComparison<unsigned_int,_unsigned_char> *)local_548,(uint *)&local_4e8,
               (uchar *)&local_4c0);
  }
  sVar4 = *(short *)((long)&local_500[2].offsetAndKind.value + 2);
  local_548._4_2_ = sVar4;
  local_548._0_4_ = 0x4d2;
  local_548._8_8_ = " == ";
  local_548._16_8_ = &DAT_00000005;
  sStack_530._0_1_ = sVar4 == 0x4d2;
  if ((!sStack_530._0_1_) && (kj::_::Debug::minSeverity < 3)) {
    local_4e8.segment._0_4_ = 0x4d2;
    local_4c0.segment._0_2_ = *(undefined2 *)((long)&local_500[2].offsetAndKind.value + 2);
    kj::_::Debug::
    log<char_const(&)[57],kj::_::DebugComparison<unsigned_int,unsigned_short>&,unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xf2,ERROR,
               "\"failed: expected \" \"(1234u) == (subReader.getUInt16Field())\", _kjCondition, 1234u, subReader.getUInt16Field()"
               ,(char (*) [57])"failed: expected (1234u) == (subReader.getUInt16Field())",
               (DebugComparison<unsigned_int,_unsigned_short> *)local_548,(uint *)&local_4e8,
               (unsigned_short *)&local_4c0);
  }
  local_548._4_4_ = local_500[2].field_1.upper32Bits;
  local_548._0_4_ = 0x3628814;
  local_548._8_8_ = " == ";
  local_548._16_8_ = &DAT_00000005;
  sStack_530 = CONCAT71(sStack_530._1_7_,local_548._4_4_ == 0x3628814);
  if ((local_548._4_4_ != 0x3628814) && (kj::_::Debug::minSeverity < 3)) {
    local_4e8.segment._0_4_ = 0x3628814;
    local_4c0.segment._0_4_ = local_500[2].field_1.upper32Bits;
    kj::_::Debug::
    log<char_const(&)[61],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xf3,ERROR,
               "\"failed: expected \" \"(56789012u) == (subReader.getUInt32Field())\", _kjCondition, 56789012u, subReader.getUInt32Field()"
               ,(char (*) [61])"failed: expected (56789012u) == (subReader.getUInt32Field())",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_548,(uint *)&local_4e8,
               (uint *)&local_4c0);
  }
  local_548._8_8_ = local_500[3];
  local_548._0_8_ = (SegmentBuilder *)0x4cc1921126f0ad2;
  local_548._16_8_ = " == ";
  sStack_530 = 5;
  local_528 = (char *)CONCAT71(local_528._1_7_,
                               (WirePointer)local_548._8_8_ == (WirePointer)0x4cc1921126f0ad2);
  if (((WirePointer)local_548._8_8_ != (WirePointer)0x4cc1921126f0ad2) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_4e8.segment = (SegmentBuilder *)0x4cc1921126f0ad2;
    local_4c0.segment = (SegmentBuilder *)local_500[3];
    kj::_::Debug::
    log<char_const(&)[73],kj::_::DebugComparison<unsigned_long_long,unsigned_long>&,unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xf4,ERROR,
               "\"failed: expected \" \"(345678901234567890ull) == (subReader.getUInt64Field())\", _kjCondition, 345678901234567890ull, subReader.getUInt64Field()"
               ,(char (*) [73])
                "failed: expected (345678901234567890ull) == (subReader.getUInt64Field())",
               (DebugComparison<unsigned_long_long,_unsigned_long> *)local_548,
               (unsigned_long_long *)&local_4e8,(unsigned_long *)&local_4c0);
  }
  fVar1 = (float)local_500[4].offsetAndKind.value;
  if ((fVar1 != -1.25e-10) || (NAN(fVar1))) {
    fVar9 = fVar1 + 1.25e-10;
    fVar13 = -fVar9;
    if (-fVar9 <= fVar9) {
      fVar13 = fVar9;
    }
    fVar9 = -fVar1;
    if (-fVar1 <= fVar1) {
      fVar9 = fVar1;
    }
    fVar9 = (fVar9 + 1.25e-10) * 1e-05;
    local_4c0.segment._0_1_ = fVar13 < fVar9;
    if ((fVar9 <= fVar13) && (kj::_::Debug::minSeverity < 3)) {
      local_548._0_4_ = fVar1;
      local_4e8.segment._0_4_ = 0xaf09705f;
      kj::_::Debug::log<char_const(&)[84],kj::_::DebugExpression<bool>&,float,float>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf5,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.getFloat32Field(), -1.25e-10f)\", _kjCondition, subReader.getFloat32Field(), -1.25e-10f"
                 ,(char (*) [84])
                  "failed: expected ::kj::_::floatAlmostEqual(subReader.getFloat32Field(), -1.25e-10f)"
                 ,(DebugExpression<bool> *)&local_4c0,(float *)local_548,(float *)&local_4e8);
    }
  }
  local_548._0_8_ = local_500[5];
  pCVar7 = local_4c0.capTable;
  if (((double)local_548._0_8_ != 345.0) || (NAN((double)local_548._0_8_))) {
    dVar12 = (double)local_548._0_8_ + -345.0;
    dVar10 = -dVar12;
    if (-dVar12 <= dVar12) {
      dVar10 = dVar12;
    }
    WVar11 = (WirePointer)-(double)local_548._0_8_;
    if (-(double)local_548._0_8_ <= (double)local_548._0_8_) {
      WVar11 = (WirePointer)local_548._0_8_;
    }
    dVar12 = ((double)WVar11 + 345.0) * 1e-12;
    local_4c0.segment._0_1_ = dVar10 < dVar12;
    if ((dVar12 <= dVar10) && (kj::_::Debug::minSeverity < 3)) {
      local_4e8.segment._0_4_ = 0x159;
      kj::_::Debug::log<char_const(&)[78],kj::_::DebugExpression<bool>&,double,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0xf6,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 345)\", _kjCondition, subReader.getFloat64Field(), 345"
                 ,(char (*) [78])
                  "failed: expected ::kj::_::doubleAlmostEqual(subReader.getFloat64Field(), 345)",
                 (DebugExpression<bool> *)&local_4c0,(double *)local_548,(int *)&local_4e8);
      pCVar7 = local_4c0.capTable;
    }
  }
  local_4c0.capTable = pCVar7;
  AVar6 = _local_510;
  local_4c0.segment = (SegmentBuilder *)"baz";
  local_548._0_8_ = local_510;
  local_548._8_4_ = WStack_508.offsetAndKind.value;
  local_548._12_4_ = WStack_508.field_1;
  local_548._16_8_ = local_4f8;
  _local_510 = AVar6;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&local_4e8,(PointerBuilder *)local_548,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_548,
             (DebugExpression<char_const(&)[4]> *)&local_4c0,(Builder *)&local_4e8);
  if ((local_518 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_4e8.segment = (SegmentBuilder *)local_510;
    local_4e8.capTable = (CapTableBuilder *)WStack_508;
    local_4e8.ptr = (byte *)local_4f8;
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&local_4c0,(PointerBuilder *)&local_4e8,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[55],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Builder>&,char_const(&)[4],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xf7,ERROR,
               "\"failed: expected \" \"(\\\"baz\\\") == (subReader.getTextField())\", _kjCondition, \"baz\", subReader.getTextField()"
               ,(char (*) [55])"failed: expected (\"baz\") == (subReader.getTextField())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Builder> *)local_548,
               (char (*) [4])0x2a1727,(Builder *)&local_4c0);
  }
  AVar6 = _local_510;
  local_4e8.capTable = (CapTableBuilder *)0x3;
  local_4e8.segment = (SegmentBuilder *)"qux";
  local_548._16_8_ = local_4f8 + 1;
  local_548._0_8_ = local_510;
  local_548._8_4_ = WStack_508.offsetAndKind.value;
  local_548._12_4_ = WStack_508.field_1;
  _local_510 = AVar6;
  local_4c0._0_16_ = PointerBuilder::getBlob<capnp::Data>((PointerBuilder *)local_548,(void *)0x0,0)
  ;
  kj::_::DebugExpression<capnp::Data::Reader>::operator==
            ((DebugExpression<capnp::Data::Reader> *)&local_4e8,(Builder *)&local_4c0);
  if ((local_518 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_4c0.capTable = (CapTableBuilder *)0x3;
    local_4c0.segment = (SegmentBuilder *)"qux";
    local_4e8.ptr = (byte *)(local_4f8 + 1);
    local_4e8.segment = (SegmentBuilder *)local_510;
    local_4e8.capTable = (CapTableBuilder *)WStack_508;
    local_4e8._0_16_ =
         PointerBuilder::getBlob<capnp::Data>((PointerBuilder *)&local_4e8,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[61],kj::_::DebugComparison<capnp::Data::Reader,capnp::Data::Builder>&,capnp::Data::Reader,capnp::Data::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xf8,ERROR,
               "\"failed: expected \" \"(data(\\\"qux\\\")) == (subReader.getDataField())\", _kjCondition, data(\"qux\"), subReader.getDataField()"
               ,(char (*) [61])"failed: expected (data(\"qux\")) == (subReader.getDataField())",
               (DebugComparison<capnp::Data::Reader,_capnp::Data::Builder> *)local_548,
               (Reader *)&local_4c0,(Builder *)&local_4e8);
  }
  AVar6 = _local_510;
  local_548._16_8_ = local_4f8 + 2;
  local_548._0_8_ = local_510;
  local_548._8_4_ = WStack_508.offsetAndKind.value;
  local_548._12_4_ = WStack_508.field_1;
  _local_510 = AVar6;
  PointerBuilder::getStruct
            ((StructBuilder *)&local_4e8,(PointerBuilder *)local_548,(StructSize)0x140006,
             (word *)0x0);
  local_498.segment = (SegmentBuilder *)0x2b06d5;
  local_548._0_8_ = local_4e8.segment;
  local_548._8_8_ = local_4e8.capTable;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&local_4c0,(PointerBuilder *)local_548,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[7]>::operator==
            ((DebugComparison<const_char_(&)[7],_capnp::Text::Builder> *)local_548,
             (DebugExpression<char_const(&)[7]> *)&local_498,(Builder *)&local_4c0);
  if ((local_518 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_4c0.segment = local_4e8.segment;
    local_4c0.capTable = local_4e8.capTable;
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&local_498,(PointerBuilder *)&local_4c0,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[61],kj::_::DebugComparison<char_const(&)[7],capnp::Text::Builder>&,char_const(&)[7],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xfb,ERROR,
               "\"failed: expected \" \"(\\\"nested\\\") == (subSubReader.getTextField())\", _kjCondition, \"nested\", subSubReader.getTextField()"
               ,(char (*) [61])"failed: expected (\"nested\") == (subSubReader.getTextField())",
               (DebugComparison<const_char_(&)[7],_capnp::Text::Builder> *)local_548,
               (char (*) [7])0x2b06d5,(Builder *)&local_498);
  }
  local_480._0_8_ = "really nested";
  local_548._16_8_ = CONCAT44(local_4e8.step,local_4e8.elementCount) + 0x10;
  local_548._0_8_ = local_4e8.segment;
  local_548._8_8_ = local_4e8.capTable;
  PointerBuilder::getStruct(&local_4c0,(PointerBuilder *)local_548,(StructSize)0x140006,(word *)0x0)
  ;
  local_548._0_8_ = local_4c0.segment;
  local_548._8_8_ = local_4c0.capTable;
  local_548._16_8_ = local_4c0.pointers;
  PointerBuilder::getBlob<capnp::Text>
            ((Builder *)&local_498,(PointerBuilder *)local_548,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[14]>::operator==
            ((DebugComparison<const_char_(&)[14],_capnp::Text::Builder> *)local_548,
             (DebugExpression<char_const(&)[14]> *)&local_480,(Builder *)&local_498);
  if ((local_518 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_498.pointer = (WirePointer *)(CONCAT44(local_4e8.step,local_4e8.elementCount) + 0x10);
    local_498.segment = local_4e8.segment;
    local_498.capTable = local_4e8.capTable;
    PointerBuilder::getStruct(&local_4c0,&local_498,(StructSize)0x140006,(word *)0x0);
    local_498.segment = local_4c0.segment;
    local_498.capTable = local_4c0.capTable;
    local_498.pointer = local_4c0.pointers;
    PointerBuilder::getBlob<capnp::Text>(&local_480,&local_498,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[85],kj::_::DebugComparison<char_const(&)[14],capnp::Text::Builder>&,char_const(&)[14],capnp::Text::Builder>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xfc,ERROR,
               "\"failed: expected \" \"(\\\"really nested\\\") == (subSubReader.getStructField().getTextField())\", _kjCondition, \"really nested\", subSubReader.getStructField().getTextField()"
               ,(char (*) [85])
                "failed: expected (\"really nested\") == (subSubReader.getStructField().getTextField())"
               ,(DebugComparison<const_char_(&)[14],_capnp::Text::Builder> *)local_548,
               (char (*) [14])"really nested",&local_480);
  }
  sVar4 = *(short *)&local_500[4].field_1;
  local_548._2_2_ = sVar4;
  local_548._0_2_ = 2;
  local_548._8_8_ = " == ";
  local_548._16_8_ = &DAT_00000005;
  sStack_530 = CONCAT71(sStack_530._1_7_,sVar4 == 2);
  if ((sVar4 != 2) && (kj::_::Debug::minSeverity < 3)) {
    local_4e8.segment._0_2_ = 2;
    local_4c0.segment._0_2_ = sVar4;
    kj::_::Debug::
    log<char_const(&)[63],kj::_::DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>&,capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0xfe,ERROR,
               "\"failed: expected \" \"(TestEnum::BAZ) == (subReader.getEnumField())\", _kjCondition, TestEnum::BAZ, subReader.getEnumField()"
               ,(char (*) [63])"failed: expected (TestEnum::BAZ) == (subReader.getEnumField())",
               (DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                *)local_548,(TestEnum_9c8e9318b29d9cd3 *)&local_4e8,
               (TestEnum_9c8e9318b29d9cd3 *)&local_4c0);
  }
  AVar6 = _local_510;
  local_548._16_8_ = local_4f8 + 3;
  local_548._0_8_ = local_510;
  local_548._8_4_ = WStack_508.offsetAndKind.value;
  local_548._12_4_ = WStack_508.field_1;
  _local_510 = AVar6;
  PointerBuilder::getList(&local_58,(PointerBuilder *)local_548,VOID,(word *)0x0);
  reader_00.builder.capTable = local_58.capTable;
  reader_00.builder.segment = local_58.segment;
  reader_00.builder.ptr = local_58.ptr;
  reader_00.builder.elementCount = local_58.elementCount;
  reader_00.builder.step = local_58.step;
  reader_00.builder.structDataSize = local_58.structDataSize;
  reader_00.builder.structPointerCount = local_58.structPointerCount;
  reader_00.builder.elementSize = local_58.elementSize;
  reader_00.builder._39_1_ = local_58._39_1_;
  expected._M_len = 3;
  expected._M_array = (iterator)local_548;
  checkList<capnp::List<capnp::Void,_(capnp::Kind)0>::Builder,_capnp::List<capnp::Void,_(capnp::Kind)0>,_false>
            (reader_00,expected);
  AVar6 = _local_510;
  local_548._16_8_ = local_4f8 + 4;
  local_548._0_8_ = local_510;
  local_548._8_4_ = WStack_508.offsetAndKind.value;
  local_548._12_4_ = WStack_508.field_1;
  _local_510 = AVar6;
  PointerBuilder::getList(&local_80,(PointerBuilder *)local_548,BIT,(word *)0x0);
  local_548._0_5_ = 0x101000100;
  reader_01.builder.capTable = local_80.capTable;
  reader_01.builder.segment = local_80.segment;
  reader_01.builder.ptr = local_80.ptr;
  reader_01.builder.elementCount = local_80.elementCount;
  reader_01.builder.step = local_80.step;
  reader_01.builder.structDataSize = local_80.structDataSize;
  reader_01.builder.structPointerCount = local_80.structPointerCount;
  reader_01.builder.elementSize = local_80.elementSize;
  reader_01.builder._39_1_ = local_80._39_1_;
  expected_00._M_len = 5;
  expected_00._M_array = (iterator)local_548;
  checkList<capnp::List<bool,_(capnp::Kind)0>::Builder,_capnp::List<bool,_(capnp::Kind)0>,_false>
            (reader_01,expected_00);
  AVar6 = _local_510;
  local_548._16_8_ = local_4f8 + 5;
  local_548._0_8_ = local_510;
  local_548._8_4_ = WStack_508.offsetAndKind.value;
  local_548._12_4_ = WStack_508.field_1;
  _local_510 = AVar6;
  PointerBuilder::getList(&local_a8,(PointerBuilder *)local_548,BYTE,(word *)0x0);
  local_548._0_4_ = 0x7f80de0c;
  reader_02.builder.capTable = local_a8.capTable;
  reader_02.builder.segment = local_a8.segment;
  reader_02.builder.ptr = local_a8.ptr;
  reader_02.builder.elementCount = local_a8.elementCount;
  reader_02.builder.step = local_a8.step;
  reader_02.builder.structDataSize = local_a8.structDataSize;
  reader_02.builder.structPointerCount = local_a8.structPointerCount;
  reader_02.builder.elementSize = local_a8.elementSize;
  reader_02.builder._39_1_ = local_a8._39_1_;
  expected_01._M_len = 4;
  expected_01._M_array = local_548;
  checkList<capnp::List<signed_char,_(capnp::Kind)0>::Builder,_capnp::List<signed_char,_(capnp::Kind)0>,_false>
            (reader_02,expected_01);
  AVar6 = _local_510;
  local_548._16_8_ = local_4f8 + 6;
  local_548._0_8_ = local_510;
  local_548._8_4_ = WStack_508.offsetAndKind.value;
  local_548._12_4_ = WStack_508.field_1;
  _local_510 = AVar6;
  PointerBuilder::getList(&local_d0,(PointerBuilder *)local_548,TWO_BYTES,(word *)0x0);
  local_548._0_8_ = (SegmentBuilder *)0x7fff8000e9d204d2;
  reader_03.builder.capTable = local_d0.capTable;
  reader_03.builder.segment = local_d0.segment;
  reader_03.builder.ptr = local_d0.ptr;
  reader_03.builder.elementCount = local_d0.elementCount;
  reader_03.builder.step = local_d0.step;
  reader_03.builder.structDataSize = local_d0.structDataSize;
  reader_03.builder.structPointerCount = local_d0.structPointerCount;
  reader_03.builder.elementSize = local_d0.elementSize;
  reader_03.builder._39_1_ = local_d0._39_1_;
  expected_02._M_len = 4;
  expected_02._M_array = (iterator)local_548;
  checkList<capnp::List<short,_(capnp::Kind)0>::Builder,_capnp::List<short,_(capnp::Kind)0>,_false>
            (reader_03,expected_02);
  AVar6 = _local_510;
  local_548._16_8_ = local_4f8 + 7;
  local_548._0_8_ = local_510;
  local_548._8_4_ = WStack_508.offsetAndKind.value;
  local_548._12_4_ = WStack_508.field_1;
  _local_510 = AVar6;
  PointerBuilder::getList(&local_f8,(PointerBuilder *)local_548,FOUR_BYTES,(word *)0x0);
  local_548._0_8_ = (SegmentBuilder *)0xfaa0d34000bc614e;
  local_548._8_8_ = (CapTableBuilder *)0x7fffffff80000000;
  reader_04.builder.capTable = local_f8.capTable;
  reader_04.builder.segment = local_f8.segment;
  reader_04.builder.ptr = local_f8.ptr;
  reader_04.builder.elementCount = local_f8.elementCount;
  reader_04.builder.step = local_f8.step;
  reader_04.builder.structDataSize = local_f8.structDataSize;
  reader_04.builder.structPointerCount = local_f8.structPointerCount;
  reader_04.builder.elementSize = local_f8.elementSize;
  reader_04.builder._39_1_ = local_f8._39_1_;
  expected_03._M_len = 4;
  expected_03._M_array = (iterator)local_548;
  checkList<capnp::List<int,_(capnp::Kind)0>::Builder,_capnp::List<int,_(capnp::Kind)0>,_false>
            (reader_04,expected_03);
  AVar6 = _local_510;
  local_548._16_8_ = local_4f8 + 8;
  local_548._0_8_ = local_510;
  local_548._8_4_ = WStack_508.offsetAndKind.value;
  local_548._12_4_ = WStack_508.field_1;
  _local_510 = AVar6;
  PointerBuilder::getList(&local_120,(PointerBuilder *)local_548,EIGHT_BYTES,(word *)0x0);
  local_548._16_8_ = (WirePointer *)0x8000000000000000;
  sStack_530 = 0x7fffffffffffffff;
  local_548._0_8_ = (SegmentBuilder *)0x7048860ddf79;
  local_548._8_8_ = (CapTableBuilder *)0xfffd968afd13752e;
  reader_05.builder.capTable = local_120.capTable;
  reader_05.builder.segment = local_120.segment;
  reader_05.builder.ptr = local_120.ptr;
  reader_05.builder.elementCount = local_120.elementCount;
  reader_05.builder.step = local_120.step;
  reader_05.builder.structDataSize = local_120.structDataSize;
  reader_05.builder.structPointerCount = local_120.structPointerCount;
  reader_05.builder.elementSize = local_120.elementSize;
  reader_05.builder._39_1_ = local_120._39_1_;
  expected_04._M_len = 4;
  expected_04._M_array = (iterator)local_548;
  checkList<capnp::List<long,_(capnp::Kind)0>::Builder,_capnp::List<long,_(capnp::Kind)0>,_false>
            (reader_05,expected_04);
  AVar6 = _local_510;
  local_548._16_8_ = local_4f8 + 9;
  local_548._0_8_ = local_510;
  local_548._8_4_ = WStack_508.offsetAndKind.value;
  local_548._12_4_ = WStack_508.field_1;
  _local_510 = AVar6;
  PointerBuilder::getList(&local_148,(PointerBuilder *)local_548,BYTE,(word *)0x0);
  local_548._0_4_ = 0xff00220c;
  reader_06.builder.capTable = local_148.capTable;
  reader_06.builder.segment = local_148.segment;
  reader_06.builder.ptr = local_148.ptr;
  reader_06.builder.elementCount = local_148.elementCount;
  reader_06.builder.step = local_148.step;
  reader_06.builder.structDataSize = local_148.structDataSize;
  reader_06.builder.structPointerCount = local_148.structPointerCount;
  reader_06.builder.elementSize = local_148.elementSize;
  reader_06.builder._39_1_ = local_148._39_1_;
  expected_05._M_len = 4;
  expected_05._M_array = local_548;
  checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
            (reader_06,expected_05);
  AVar6 = _local_510;
  local_548._16_8_ = local_4f8 + 10;
  local_548._0_8_ = local_510;
  local_548._8_4_ = WStack_508.offsetAndKind.value;
  local_548._12_4_ = WStack_508.field_1;
  _local_510 = AVar6;
  PointerBuilder::getList(&local_170,(PointerBuilder *)local_548,TWO_BYTES,(word *)0x0);
  local_548._0_8_ = (SegmentBuilder *)0xffff0000162e04d2;
  reader_07.builder.capTable = local_170.capTable;
  reader_07.builder.segment = local_170.segment;
  reader_07.builder.ptr = local_170.ptr;
  reader_07.builder.elementCount = local_170.elementCount;
  reader_07.builder.step = local_170.step;
  reader_07.builder.structDataSize = local_170.structDataSize;
  reader_07.builder.structPointerCount = local_170.structPointerCount;
  reader_07.builder.elementSize = local_170.elementSize;
  reader_07.builder._39_1_ = local_170._39_1_;
  expected_06._M_len = 4;
  expected_06._M_array = (iterator)local_548;
  checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
            (reader_07,expected_06);
  AVar6 = _local_510;
  local_548._16_8_ = local_4f8 + 0xb;
  local_548._0_8_ = local_510;
  local_548._8_4_ = WStack_508.offsetAndKind.value;
  local_548._12_4_ = WStack_508.field_1;
  _local_510 = AVar6;
  PointerBuilder::getList(&local_198,(PointerBuilder *)local_548,FOUR_BYTES,(word *)0x0);
  local_548._0_8_ = (SegmentBuilder *)0x55f2cc000bc614e;
  local_548._8_8_ = (CapTableBuilder *)0xffffffff00000000;
  reader_08.builder.capTable = local_198.capTable;
  reader_08.builder.segment = local_198.segment;
  reader_08.builder.ptr = local_198.ptr;
  reader_08.builder.elementCount = local_198.elementCount;
  reader_08.builder.step = local_198.step;
  reader_08.builder.structDataSize = local_198.structDataSize;
  reader_08.builder.structPointerCount = local_198.structPointerCount;
  reader_08.builder.elementSize = local_198.elementSize;
  reader_08.builder._39_1_ = local_198._39_1_;
  expected_07._M_len = 4;
  expected_07._M_array = (iterator)local_548;
  checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
            (reader_08,expected_07);
  AVar6 = _local_510;
  local_548._16_8_ = local_4f8 + 0xc;
  local_548._0_8_ = local_510;
  local_548._8_4_ = WStack_508.offsetAndKind.value;
  local_548._12_4_ = WStack_508.field_1;
  _local_510 = AVar6;
  PointerBuilder::getList(&local_1c0,(PointerBuilder *)local_548,EIGHT_BYTES,(word *)0x0);
  local_548._16_8_ = (WirePointer *)0x0;
  sStack_530 = 0xffffffffffffffff;
  local_548._0_8_ = (SegmentBuilder *)0x7048860ddf79;
  local_548._8_8_ = (CapTableBuilder *)0x2697502ec8ad2;
  reader_09.builder.capTable = local_1c0.capTable;
  reader_09.builder.segment = local_1c0.segment;
  reader_09.builder.ptr = local_1c0.ptr;
  reader_09.builder.elementCount = local_1c0.elementCount;
  reader_09.builder.step = local_1c0.step;
  reader_09.builder.structDataSize = local_1c0.structDataSize;
  reader_09.builder.structPointerCount = local_1c0.structPointerCount;
  reader_09.builder.elementSize = local_1c0.elementSize;
  reader_09.builder._39_1_ = local_1c0._39_1_;
  expected_08._M_len = 4;
  expected_08._M_array = (iterator)local_548;
  checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_long,_(capnp::Kind)0>,_false>
            (reader_09,expected_08);
  AVar6 = _local_510;
  local_548._16_8_ = local_4f8 + 0xd;
  local_548._0_8_ = local_510;
  local_548._8_4_ = WStack_508.offsetAndKind.value;
  local_548._12_4_ = WStack_508.field_1;
  _local_510 = AVar6;
  PointerBuilder::getList(&local_1e8,(PointerBuilder *)local_548,FOUR_BYTES,(word *)0x0);
  local_548._0_8_ = (SegmentBuilder *)0x4996b43800000000;
  local_548._8_8_ = (CapTableBuilder *)0xfcf0bdc27cf0bdc2;
  local_548._16_8_ = (WirePointer *)0x82081cea02081cea;
  reader_10.builder.capTable = local_1e8.capTable;
  reader_10.builder.segment = local_1e8.segment;
  reader_10.builder.ptr = local_1e8.ptr;
  reader_10.builder.elementCount = local_1e8.elementCount;
  reader_10.builder.step = local_1e8.step;
  reader_10.builder.structDataSize = local_1e8.structDataSize;
  reader_10.builder.structPointerCount = local_1e8.structPointerCount;
  reader_10.builder.elementSize = local_1e8.elementSize;
  reader_10.builder._39_1_ = local_1e8._39_1_;
  expected_09._M_len = 6;
  expected_09._M_array = (iterator)local_548;
  checkList<capnp::List<float,_(capnp::Kind)0>::Builder,_capnp::List<float,_(capnp::Kind)0>,_false>
            (reader_10,expected_09);
  AVar6 = _local_510;
  local_548._16_8_ = local_4f8 + 0xe;
  local_548._0_8_ = local_510;
  local_548._8_4_ = WStack_508.offsetAndKind.value;
  local_548._12_4_ = WStack_508.field_1;
  _local_510 = AVar6;
  PointerBuilder::getList(&local_210,(PointerBuilder *)local_548,EIGHT_BYTES,(word *)0x0);
  local_528 = (char *)0x66789e3750f791;
  sStack_520 = 0x8066789e3750f791;
  local_548._16_8_ = (WirePointer *)0x7f76c8e5ca239029;
  sStack_530 = 0xff76c8e5ca239029;
  local_548._0_8_ = (SegmentBuilder *)0x0;
  local_548._8_8_ = (CapTableBuilder *)0x42dc12218377de40;
  reader_11.builder.capTable = local_210.capTable;
  reader_11.builder.segment = local_210.segment;
  reader_11.builder.ptr = local_210.ptr;
  reader_11.builder.elementCount = local_210.elementCount;
  reader_11.builder.step = local_210.step;
  reader_11.builder.structDataSize = local_210.structDataSize;
  reader_11.builder.structPointerCount = local_210.structPointerCount;
  reader_11.builder.elementSize = local_210.elementSize;
  reader_11.builder._39_1_ = local_210._39_1_;
  expected_10._M_len = 6;
  expected_10._M_array = (iterator)local_548;
  checkList<capnp::List<double,_(capnp::Kind)0>::Builder,_capnp::List<double,_(capnp::Kind)0>,_false>
            (reader_11,expected_10);
  AVar6 = _local_510;
  local_548._16_8_ = local_4f8 + 0xf;
  local_548._0_8_ = local_510;
  local_548._8_4_ = WStack_508.offsetAndKind.value;
  local_548._12_4_ = WStack_508.field_1;
  _local_510 = AVar6;
  PointerBuilder::getList(&local_238,(PointerBuilder *)local_548,POINTER,(word *)0x0);
  local_548._0_8_ = "quux";
  local_548._8_8_ = &DAT_00000005;
  local_548._16_8_ = "corge";
  sStack_530 = 6;
  local_528 = "grault";
  sStack_520 = 7;
  reader_12.builder.capTable = local_238.capTable;
  reader_12.builder.segment = local_238.segment;
  reader_12.builder.ptr = local_238.ptr;
  reader_12.builder.elementCount = local_238.elementCount;
  reader_12.builder.step = local_238.step;
  reader_12.builder.structDataSize = local_238.structDataSize;
  reader_12.builder.structPointerCount = local_238.structPointerCount;
  reader_12.builder.elementSize = local_238.elementSize;
  reader_12.builder._39_1_ = local_238._39_1_;
  expected_11._M_len = 3;
  expected_11._M_array = (iterator)local_548;
  checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Text,_(capnp::Kind)1>,_false>
            (reader_12,expected_11);
  AVar6 = _local_510;
  local_548._16_8_ = local_4f8 + 0x10;
  local_548._0_8_ = local_510;
  local_548._8_4_ = WStack_508.offsetAndKind.value;
  local_548._12_4_ = WStack_508.field_1;
  _local_510 = AVar6;
  PointerBuilder::getList(&local_260,(PointerBuilder *)local_548,POINTER,(word *)0x0);
  local_548._0_8_ = "garply";
  local_548._8_8_ = (CapTableBuilder *)0x6;
  local_548._16_8_ = anon_var_dwarf_b858a;
  sStack_530 = 5;
  local_528 = "fred";
  sStack_520 = 4;
  reader_13.builder.capTable = local_260.capTable;
  reader_13.builder.segment = local_260.segment;
  reader_13.builder.ptr = local_260.ptr;
  reader_13.builder.elementCount = local_260.elementCount;
  reader_13.builder.step = local_260.step;
  reader_13.builder.structDataSize = local_260.structDataSize;
  reader_13.builder.structPointerCount = local_260.structPointerCount;
  reader_13.builder.elementSize = local_260.elementSize;
  reader_13.builder._39_1_ = local_260._39_1_;
  expected_12._M_len = 3;
  expected_12._M_array = (iterator)local_548;
  checkList<capnp::List<capnp::Data,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Data,_(capnp::Kind)1>,_false>
            (reader_13,expected_12);
  AVar6 = _local_510;
  local_548._16_8_ = local_4f8 + 0x11;
  local_548._0_8_ = local_510;
  local_548._8_4_ = WStack_508.offsetAndKind.value;
  local_548._12_4_ = WStack_508.field_1;
  _local_510 = AVar6;
  PointerBuilder::getStructList
            (&local_4e8,(PointerBuilder *)local_548,(StructSize)0x140006,(word *)0x0);
  local_548._4_4_ = local_4e8.elementCount;
  local_548._0_4_ = 3;
  local_548._8_8_ = " == ";
  local_548._16_8_ = &DAT_00000005;
  sStack_530 = CONCAT71(sStack_530._1_7_,local_4e8.elementCount == 3);
  if (local_4e8.elementCount == 3) {
    local_480._0_8_ = "x structlist 1";
    ListBuilder::getStructElement(&local_4c0,&local_4e8,0);
    local_548._0_8_ = local_4c0.segment;
    local_548._8_8_ = local_4c0.capTable;
    local_548._16_8_ = local_4c0.pointers;
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&local_498,(PointerBuilder *)local_548,(void *)0x0,0);
    kj::_::DebugExpression<char_const(&)[15]>::operator==
              ((DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)local_548,
               (DebugExpression<char_const(&)[15]> *)&local_480,(Builder *)&local_498);
    if ((local_518 == false) && (kj::_::Debug::minSeverity < 3)) {
      ListBuilder::getStructElement(&local_4c0,&local_4e8,0);
      local_498.segment = local_4c0.segment;
      local_498.capTable = local_4c0.capTable;
      local_498.pointer = local_4c0.pointers;
      PointerBuilder::getBlob<capnp::Text>(&local_480,&local_498,(void *)0x0,0);
      kj::_::Debug::
      log<char_const(&)[70],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Builder>&,char_const(&)[15],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x112,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 1\\\") == (listReader[0].getTextField())\", _kjCondition, \"x structlist 1\", listReader[0].getTextField()"
                 ,(char (*) [70])
                  "failed: expected (\"x structlist 1\") == (listReader[0].getTextField())",
                 (DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)local_548,
                 (char (*) [15])"x structlist 1",&local_480);
    }
    local_480._0_8_ = "x structlist 2";
    ListBuilder::getStructElement(&local_4c0,&local_4e8,1);
    local_548._0_8_ = local_4c0.segment;
    local_548._8_8_ = local_4c0.capTable;
    local_548._16_8_ = local_4c0.pointers;
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&local_498,(PointerBuilder *)local_548,(void *)0x0,0);
    kj::_::DebugExpression<char_const(&)[15]>::operator==
              ((DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)local_548,
               (DebugExpression<char_const(&)[15]> *)&local_480,(Builder *)&local_498);
    if ((local_518 == false) && (kj::_::Debug::minSeverity < 3)) {
      ListBuilder::getStructElement(&local_4c0,&local_4e8,1);
      local_498.segment = local_4c0.segment;
      local_498.capTable = local_4c0.capTable;
      local_498.pointer = local_4c0.pointers;
      PointerBuilder::getBlob<capnp::Text>(&local_480,&local_498,(void *)0x0,0);
      kj::_::Debug::
      log<char_const(&)[70],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Builder>&,char_const(&)[15],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x113,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 2\\\") == (listReader[1].getTextField())\", _kjCondition, \"x structlist 2\", listReader[1].getTextField()"
                 ,(char (*) [70])
                  "failed: expected (\"x structlist 2\") == (listReader[1].getTextField())",
                 (DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)local_548,
                 (char (*) [15])"x structlist 2",&local_480);
    }
    local_480._0_8_ = "x structlist 3";
    ListBuilder::getStructElement(&local_4c0,&local_4e8,2);
    local_548._0_8_ = local_4c0.segment;
    local_548._8_8_ = local_4c0.capTable;
    local_548._16_8_ = local_4c0.pointers;
    PointerBuilder::getBlob<capnp::Text>
              ((Builder *)&local_498,(PointerBuilder *)local_548,(void *)0x0,0);
    kj::_::DebugExpression<char_const(&)[15]>::operator==
              ((DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)local_548,
               (DebugExpression<char_const(&)[15]> *)&local_480,(Builder *)&local_498);
    if ((local_518 == false) && (kj::_::Debug::minSeverity < 3)) {
      ListBuilder::getStructElement(&local_4c0,&local_4e8,2);
      local_498.segment = local_4c0.segment;
      local_498.capTable = local_4c0.capTable;
      local_498.pointer = local_4c0.pointers;
      PointerBuilder::getBlob<capnp::Text>(&local_480,&local_498,(void *)0x0,0);
      kj::_::Debug::
      log<char_const(&)[70],kj::_::DebugComparison<char_const(&)[15],capnp::Text::Builder>&,char_const(&)[15],capnp::Text::Builder>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x114,ERROR,
                 "\"failed: expected \" \"(\\\"x structlist 3\\\") == (listReader[2].getTextField())\", _kjCondition, \"x structlist 3\", listReader[2].getTextField()"
                 ,(char (*) [70])
                  "failed: expected (\"x structlist 3\") == (listReader[2].getTextField())",
                 (DebugComparison<const_char_(&)[15],_capnp::Text::Builder> *)local_548,
                 (char (*) [15])"x structlist 3",&local_480);
    }
    AVar6 = _local_510;
    local_548._16_8_ = local_4f8 + 0x12;
    local_548._0_8_ = local_510;
    local_548._8_4_ = WStack_508.offsetAndKind.value;
    local_548._12_4_ = WStack_508.field_1;
    _local_510 = AVar6;
    PointerBuilder::getList(&local_288,(PointerBuilder *)local_548,TWO_BYTES,(word *)0x0);
    local_548._0_6_ = 0x600010003;
    reader_14.builder.capTable = local_288.capTable;
    reader_14.builder.segment = local_288.segment;
    reader_14.builder.ptr = local_288.ptr;
    reader_14.builder.elementCount = local_288.elementCount;
    reader_14.builder.step = local_288.step;
    reader_14.builder.structDataSize = local_288.structDataSize;
    reader_14.builder.structPointerCount = local_288.structPointerCount;
    reader_14.builder.elementSize = local_288.elementSize;
    reader_14.builder._39_1_ = local_288._39_1_;
    expected_13._M_len = 3;
    expected_13._M_array = (iterator)local_548;
    checkList<capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)0>::Builder,_capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>,_false>
              (reader_14,expected_13);
    sVar4 = *(short *)(in_stack_00000018 + 0x24);
    local_548._2_2_ = sVar4;
    local_548._0_2_ = 5;
    local_548._8_8_ = " == ";
    local_548._16_8_ = &DAT_00000005;
    sStack_530 = CONCAT71(sStack_530._1_7_,sVar4 == 5);
    if ((sVar4 != 5) && (kj::_::Debug::minSeverity < 3)) {
      local_510._0_2_ = 5;
      local_4e8.segment._0_2_ = sVar4;
      kj::_::Debug::
      log<char_const(&)[62],kj::_::DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>&,capnp::schemas::TestEnum_9c8e9318b29d9cd3,capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x118,ERROR,
                 "\"failed: expected \" \"(TestEnum::CORGE) == (reader.getEnumField())\", _kjCondition, TestEnum::CORGE, reader.getEnumField()"
                 ,(char (*) [62])"failed: expected (TestEnum::CORGE) == (reader.getEnumField())",
                 (DebugComparison<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_capnp::schemas::TestEnum_9c8e9318b29d9cd3>
                  *)local_548,(TestEnum_9c8e9318b29d9cd3 *)local_510,
                 (TestEnum_9c8e9318b29d9cd3 *)&local_4e8);
    }
    local_500 = in_stack_00000020 + 3;
    PointerBuilder::getList((ListBuilder *)local_548,(PointerBuilder *)local_510,VOID,(word *)0x0);
    local_510._4_4_ = (ListElementCount)sStack_530;
    local_510._0_4_ = 6;
    WStack_508 = (WirePointer)0x299598;
    local_500 = (WirePointer *)&DAT_00000005;
    bVar8 = (ListElementCount)sStack_530 == 6;
    local_4f8._0_1_ = bVar8;
    if ((!bVar8) && (kj::_::Debug::minSeverity < 3)) {
      local_4c0.segment._0_4_ = 6;
      local_4e8.ptr = (byte *)(in_stack_00000020 + 3);
      local_4e8.capTable = (CapTableBuilder *)in_stack_00000010;
      local_4e8.segment = in_stack_00000008;
      PointerBuilder::getList
                ((ListBuilder *)local_548,(PointerBuilder *)&local_4e8,VOID,(word *)0x0);
      local_4e8.segment._0_4_ = (ListElementCount)sStack_530;
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x11a,ERROR,
                 "\"failed: expected \" \"(6u) == (reader.getVoidList().size())\", _kjCondition, 6u, reader.getVoidList().size()"
                 ,(char (*) [55])"failed: expected (6u) == (reader.getVoidList().size())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_510,(uint *)&local_4c0,
                 (uint *)&local_4e8);
    }
    local_548._16_8_ = in_stack_00000020 + 4;
    local_548._4_4_ = (undefined4)((ulong)in_stack_00000008 >> 0x20);
    uVar5 = local_548._4_4_;
    PointerBuilder::getList(&local_2b0,(PointerBuilder *)local_548,BIT,(word *)0x0);
    local_548._0_4_ = 0x1000001;
    reader_15.builder.capTable = local_2b0.capTable;
    reader_15.builder.segment = local_2b0.segment;
    reader_15.builder.ptr = local_2b0.ptr;
    reader_15.builder.elementCount = local_2b0.elementCount;
    reader_15.builder.step = local_2b0.step;
    reader_15.builder.structDataSize = local_2b0.structDataSize;
    reader_15.builder.structPointerCount = local_2b0.structPointerCount;
    reader_15.builder.elementSize = local_2b0.elementSize;
    reader_15.builder._39_1_ = local_2b0._39_1_;
    expected_14._M_len = 4;
    expected_14._M_array = (iterator)local_548;
    checkList<capnp::List<bool,_(capnp::Kind)0>::Builder,_capnp::List<bool,_(capnp::Kind)0>,_false>
              (reader_15,expected_14);
    local_548._16_8_ = in_stack_00000020 + 5;
    local_548._0_8_ = in_stack_00000008;
    PointerBuilder::getList(&local_2d8,(PointerBuilder *)local_548,BYTE,(word *)0x0);
    local_548._0_2_ = 0x916f;
    reader_16.builder.capTable = local_2d8.capTable;
    reader_16.builder.segment = local_2d8.segment;
    reader_16.builder.ptr = local_2d8.ptr;
    reader_16.builder.elementCount = local_2d8.elementCount;
    reader_16.builder.step = local_2d8.step;
    reader_16.builder.structDataSize = local_2d8.structDataSize;
    reader_16.builder.structPointerCount = local_2d8.structPointerCount;
    reader_16.builder.elementSize = local_2d8.elementSize;
    reader_16.builder._39_1_ = local_2d8._39_1_;
    expected_15._M_len = 2;
    expected_15._M_array = local_548;
    checkList<capnp::List<signed_char,_(capnp::Kind)0>::Builder,_capnp::List<signed_char,_(capnp::Kind)0>,_false>
              (reader_16,expected_15);
    local_548._16_8_ = in_stack_00000020 + 6;
    local_548._4_4_ = uVar5;
    PointerBuilder::getList(&local_300,(PointerBuilder *)local_548,TWO_BYTES,(word *)0x0);
    local_548._0_4_ = 0xd4992b67;
    reader_17.builder.capTable = local_300.capTable;
    reader_17.builder.segment = local_300.segment;
    reader_17.builder.ptr = local_300.ptr;
    reader_17.builder.elementCount = local_300.elementCount;
    reader_17.builder.step = local_300.step;
    reader_17.builder.structDataSize = local_300.structDataSize;
    reader_17.builder.structPointerCount = local_300.structPointerCount;
    reader_17.builder.elementSize = local_300.elementSize;
    reader_17.builder._39_1_ = local_300._39_1_;
    expected_16._M_len = 2;
    expected_16._M_array = (iterator)local_548;
    checkList<capnp::List<short,_(capnp::Kind)0>::Builder,_capnp::List<short,_(capnp::Kind)0>,_false>
              (reader_17,expected_16);
    local_548._16_8_ = in_stack_00000020 + 7;
    PointerBuilder::getList(&local_328,(PointerBuilder *)local_548,FOUR_BYTES,(word *)0x0);
    local_548._0_8_ = (SegmentBuilder *)0xf9609439069f6bc7;
    reader_18.builder.capTable = local_328.capTable;
    reader_18.builder.segment = local_328.segment;
    reader_18.builder.ptr = local_328.ptr;
    reader_18.builder.elementCount = local_328.elementCount;
    reader_18.builder.step = local_328.step;
    reader_18.builder.structDataSize = local_328.structDataSize;
    reader_18.builder.structPointerCount = local_328.structPointerCount;
    reader_18.builder.elementSize = local_328.elementSize;
    reader_18.builder._39_1_ = local_328._39_1_;
    expected_17._M_len = 2;
    expected_17._M_array = (iterator)local_548;
    checkList<capnp::List<int,_(capnp::Kind)0>::Builder,_capnp::List<int,_(capnp::Kind)0>,_false>
              (reader_18,expected_17);
    local_548._16_8_ = in_stack_00000020 + 8;
    PointerBuilder::getList(&local_350,(PointerBuilder *)local_548,EIGHT_BYTES,(word *)0x0);
    local_548._0_8_ = (SegmentBuilder *)0xf6b75ab2bc471c7;
    local_548._8_8_ = (CapTableBuilder *)0xf0948a54d43b8e39;
    reader_19.builder.capTable = local_350.capTable;
    reader_19.builder.segment = local_350.segment;
    reader_19.builder.ptr = local_350.ptr;
    reader_19.builder.elementCount = local_350.elementCount;
    reader_19.builder.step = local_350.step;
    reader_19.builder.structDataSize = local_350.structDataSize;
    reader_19.builder.structPointerCount = local_350.structPointerCount;
    reader_19.builder.elementSize = local_350.elementSize;
    reader_19.builder._39_1_ = local_350._39_1_;
    expected_18._M_len = 2;
    expected_18._M_array = (iterator)local_548;
    checkList<capnp::List<long,_(capnp::Kind)0>::Builder,_capnp::List<long,_(capnp::Kind)0>,_false>
              (reader_19,expected_18);
    local_548._16_8_ = in_stack_00000020 + 9;
    local_548._0_8_ = in_stack_00000008;
    PointerBuilder::getList(&local_378,(PointerBuilder *)local_548,BYTE,(word *)0x0);
    local_548._0_2_ = 0xde6f;
    reader_20.builder.capTable = local_378.capTable;
    reader_20.builder.segment = local_378.segment;
    reader_20.builder.ptr = local_378.ptr;
    reader_20.builder.elementCount = local_378.elementCount;
    reader_20.builder.step = local_378.step;
    reader_20.builder.structDataSize = local_378.structDataSize;
    reader_20.builder.structPointerCount = local_378.structPointerCount;
    reader_20.builder.elementSize = local_378.elementSize;
    reader_20.builder._39_1_ = local_378._39_1_;
    expected_19._M_len = 2;
    expected_19._M_array = local_548;
    checkList<capnp::List<unsigned_char,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_char,_(capnp::Kind)0>,_false>
              (reader_20,expected_19);
    local_548._16_8_ = in_stack_00000020 + 10;
    local_548._4_4_ = uVar5;
    PointerBuilder::getList(&local_3a0,(PointerBuilder *)local_548,TWO_BYTES,(word *)0x0);
    local_548._0_4_ = 0xad9c8235;
    reader_21.builder.capTable = local_3a0.capTable;
    reader_21.builder.segment = local_3a0.segment;
    reader_21.builder.ptr = local_3a0.ptr;
    reader_21.builder.elementCount = local_3a0.elementCount;
    reader_21.builder.step = local_3a0.step;
    reader_21.builder.structDataSize = local_3a0.structDataSize;
    reader_21.builder.structPointerCount = local_3a0.structPointerCount;
    reader_21.builder.elementSize = local_3a0.elementSize;
    reader_21.builder._39_1_ = local_3a0._39_1_;
    expected_20._M_len = 2;
    expected_20._M_array = (iterator)local_548;
    checkList<capnp::List<unsigned_short,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_short,_(capnp::Kind)0>,_false>
              (reader_21,expected_20);
    local_548._16_8_ = in_stack_00000020 + 0xb;
    local_548._4_4_ = uVar5;
    PointerBuilder::getList(&local_3c8,(PointerBuilder *)local_548,FOUR_BYTES,(word *)0x0);
    local_548._0_4_ = 0xc6aea155;
    reader_22.builder.capTable = local_3c8.capTable;
    reader_22.builder.segment = local_3c8.segment;
    reader_22.builder.ptr = local_3c8.ptr;
    reader_22.builder.elementCount = local_3c8.elementCount;
    reader_22.builder.step = local_3c8.step;
    reader_22.builder.structDataSize = local_3c8.structDataSize;
    reader_22.builder.structPointerCount = local_3c8.structPointerCount;
    reader_22.builder.elementSize = local_3c8.elementSize;
    reader_22.builder._39_1_ = local_3c8._39_1_;
    expected_21._M_len = 1;
    expected_21._M_array = (iterator)local_548;
    checkList<capnp::List<unsigned_int,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_int,_(capnp::Kind)0>,_false>
              (reader_22,expected_21);
    local_548._16_8_ = in_stack_00000020 + 0xc;
    PointerBuilder::getList(&local_3f0,(PointerBuilder *)local_548,EIGHT_BYTES,(word *)0x0);
    local_548._0_8_ = (SegmentBuilder *)0x9a3298afb5ac71c7;
    reader_23.builder.capTable = local_3f0.capTable;
    reader_23.builder.segment = local_3f0.segment;
    reader_23.builder.ptr = local_3f0.ptr;
    reader_23.builder.elementCount = local_3f0.elementCount;
    reader_23.builder.step = local_3f0.step;
    reader_23.builder.structDataSize = local_3f0.structDataSize;
    reader_23.builder.structPointerCount = local_3f0.structPointerCount;
    reader_23.builder.elementSize = local_3f0.elementSize;
    reader_23.builder._39_1_ = local_3f0._39_1_;
    expected_22._M_len = 1;
    expected_22._M_array = (iterator)local_548;
    checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_long,_(capnp::Kind)0>,_false>
              (reader_23,expected_22);
    local_500 = in_stack_00000020 + 0xd;
    PointerBuilder::getList
              ((ListBuilder *)local_548,(PointerBuilder *)local_510,FOUR_BYTES,(word *)0x0);
    local_510._4_4_ = (ListElementCount)sStack_530;
    local_510._0_4_ = 4;
    WStack_508 = (WirePointer)" == ";
    local_500 = (WirePointer *)&DAT_00000005;
    local_4f8 = (WirePointer *)CONCAT71(local_4f8._1_7_,(ListElementCount)sStack_530 == 4);
    if ((ListElementCount)sStack_530 == 4) {
      local_510._4_4_ = ((WireValue<uint32_t> *)local_548._16_8_)->value;
      local_4f8._0_1_ = (float)local_510._4_4_ == 5555.5;
      local_510._0_4_ = 0x45ad9c00;
      WStack_508 = (WirePointer)" == ";
      local_500 = (WirePointer *)&DAT_00000005;
      if ((((float)local_510._4_4_ != 5555.5) || (NAN((float)local_510._4_4_))) &&
         (kj::_::Debug::minSeverity < 3)) {
        local_4e8.segment._0_4_ = 0x45ad9c00;
        local_4c0.segment._0_4_ = ((WireValue<uint32_t> *)local_548._16_8_)->value;
        kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<float,float>&,float,float>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x127,ERROR,
                   "\"failed: expected \" \"(5555.5f) == (listReader[0])\", _kjCondition, 5555.5f, listReader[0]"
                   ,(char (*) [46])"failed: expected (5555.5f) == (listReader[0])",
                   (DebugComparison<float,_float> *)local_510,(float *)&local_4e8,
                   (float *)&local_4c0);
      }
      local_510._4_4_ =
           *(float *)((long)&((WireValue<uint32_t> *)local_548._16_8_)->value + (sStack_530 >> 0x23)
                     );
      local_4f8._0_1_ = INFINITY <= (float)local_510._4_4_;
      local_510._0_4_ = 0x7f800000;
      WStack_508 = (WirePointer)" == ";
      local_500 = (WirePointer *)&DAT_00000005;
      if ((!local_4f8._0_1_) && (kj::_::Debug::minSeverity < 3)) {
        local_4e8.segment._0_4_ = 0x7f800000;
        local_4c0.segment._0_4_ =
             *(undefined4 *)
              ((long)&((WireValue<uint32_t> *)local_548._16_8_)->value + (sStack_530 >> 0x23));
        kj::_::Debug::log<char_const(&)[48],kj::_::DebugComparison<float,float>&,float,float>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x128,ERROR,
                   "\"failed: expected \" \"(kj::inf()) == (listReader[1])\", _kjCondition, kj::inf(), listReader[1]"
                   ,(char (*) [48])"failed: expected (kj::inf()) == (listReader[1])",
                   (DebugComparison<float,_float> *)local_510,(float *)&local_4e8,
                   (float *)&local_4c0);
      }
      local_510._4_4_ =
           *(float *)((long)&((WireValue<uint32_t> *)local_548._16_8_)->value + (sStack_530 >> 0x22)
                     );
      local_510._0_4_ = 0xff800000;
      WStack_508 = (WirePointer)" == ";
      local_500 = (WirePointer *)&DAT_00000005;
      local_4f8 = (WirePointer *)CONCAT71(local_4f8._1_7_,(float)local_510._4_4_ <= -INFINITY);
      if (((float)local_510._4_4_ > -INFINITY) && (kj::_::Debug::minSeverity < 3)) {
        local_4e8.segment._0_4_ = 0xff800000;
        local_4c0.segment._0_4_ =
             *(undefined4 *)
              ((long)&((WireValue<uint32_t> *)local_548._16_8_)->value + (sStack_530 >> 0x22));
        kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<float,float>&,float,float>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x129,ERROR,
                   "\"failed: expected \" \"(-kj::inf()) == (listReader[2])\", _kjCondition, -kj::inf(), listReader[2]"
                   ,(char (*) [49])"failed: expected (-kj::inf()) == (listReader[2])",
                   (DebugComparison<float,_float> *)local_510,(float *)&local_4e8,
                   (float *)&local_4c0);
      }
      bVar8 = NAN(*(float *)((long)&((WireValue<uint32_t> *)local_548._16_8_)->value +
                            ((sStack_530 >> 0x20) * 3 >> 3)));
      local_510[0] = bVar8;
      if ((!bVar8) && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x12a,ERROR,"\"failed: expected \" \"isNaN(listReader[3])\", _kjCondition",
                   (char (*) [38])"failed: expected isNaN(listReader[3])",
                   (DebugExpression<bool> *)local_510);
      }
      local_500 = in_stack_00000020 + 0xe;
      PointerBuilder::getList
                ((ListBuilder *)local_548,(PointerBuilder *)local_510,EIGHT_BYTES,(word *)0x0);
      local_510._4_4_ = (ListElementCount)sStack_530;
      local_510._0_4_ = 4;
      WStack_508 = (WirePointer)" == ";
      local_500 = (WirePointer *)&DAT_00000005;
      local_4f8 = (WirePointer *)CONCAT71(local_4f8._1_7_,(ListElementCount)sStack_530 == 4);
      if ((ListElementCount)sStack_530 != 4) {
        local_4c0.segment._0_4_ = 4;
        local_498.segment =
             (SegmentBuilder *)CONCAT44(local_498.segment._4_4_,(ListElementCount)sStack_530);
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                  ((Fault *)&local_4e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x12e,FAILED,"(4u) == (listReader.size())","_kjCondition,4u, listReader.size()",
                   (DebugComparison<unsigned_int,_unsigned_int> *)local_510,(uint *)&local_4c0,
                   (uint *)&local_498);
        kj::_::Debug::Fault::fatal((Fault *)&local_4e8);
      }
      WVar11 = *(WirePointer *)local_548._16_8_;
      local_4f0 = (double)WVar11 == 7777.75;
      WStack_508.offsetAndKind.value = WVar11.offsetAndKind.value;
      WStack_508.field_1 = WVar11.field_1;
      local_510 = (undefined1  [8])0x40be61c000000000;
      local_500 = (WirePointer *)0x299598;
      local_4f8 = (WirePointer *)&DAT_00000005;
      if ((((double)WVar11 != 7777.75) || (NAN((double)WVar11))) && (kj::_::Debug::minSeverity < 3))
      {
        local_4e8.segment = (SegmentBuilder *)0x40be61c000000000;
        local_4c0.segment = (SegmentBuilder *)*(WirePointer *)local_548._16_8_;
        kj::_::Debug::log<char_const(&)[46],kj::_::DebugComparison<double,double>&,double,double>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x12f,ERROR,
                   "\"failed: expected \" \"(7777.75) == (listReader[0])\", _kjCondition, 7777.75, listReader[0]"
                   ,(char (*) [46])"failed: expected (7777.75) == (listReader[0])",
                   (DebugComparison<double,_double> *)local_510,(double *)&local_4e8,
                   (double *)&local_4c0);
      }
      dVar12 = *(double *)
                ((long)&((WireValue<uint32_t> *)local_548._16_8_)->value + (sStack_530 >> 0x23));
      local_4f0 = INFINITY <= dVar12;
      local_510._0_4_ = 0x7f800000;
      WStack_508 = (WirePointer)dVar12;
      local_500 = (WirePointer *)0x299598;
      local_4f8 = (WirePointer *)&DAT_00000005;
      if ((!local_4f0) && (kj::_::Debug::minSeverity < 3)) {
        local_4c0.segment._0_4_ = 0x7f800000;
        local_4e8.segment =
             (SegmentBuilder *)
             *(uchar **)
              ((long)&((WireValue<uint32_t> *)local_548._16_8_)->value + (sStack_530 >> 0x23));
        kj::_::Debug::log<char_const(&)[48],kj::_::DebugComparison<float,double>&,float,double>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x130,ERROR,
                   "\"failed: expected \" \"(kj::inf()) == (listReader[1])\", _kjCondition, kj::inf(), listReader[1]"
                   ,(char (*) [48])"failed: expected (kj::inf()) == (listReader[1])",
                   (DebugComparison<float,_double> *)local_510,(float *)&local_4c0,
                   (double *)&local_4e8);
      }
      dVar12 = *(double *)
                ((long)&((WireValue<uint32_t> *)local_548._16_8_)->value + (sStack_530 >> 0x22));
      local_4f0 = dVar12 <= -INFINITY;
      local_510._0_4_ = 0xff800000;
      WStack_508 = (WirePointer)dVar12;
      local_500 = (WirePointer *)0x299598;
      local_4f8 = (WirePointer *)&DAT_00000005;
      if ((!local_4f0) && (kj::_::Debug::minSeverity < 3)) {
        local_4c0.segment._0_4_ = 0xff800000;
        local_4e8.segment =
             (SegmentBuilder *)
             *(uchar **)
              ((long)&((WireValue<uint32_t> *)local_548._16_8_)->value + (sStack_530 >> 0x22));
        kj::_::Debug::log<char_const(&)[49],kj::_::DebugComparison<float,double>&,float,double>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x131,ERROR,
                   "\"failed: expected \" \"(-kj::inf()) == (listReader[2])\", _kjCondition, -kj::inf(), listReader[2]"
                   ,(char (*) [49])"failed: expected (-kj::inf()) == (listReader[2])",
                   (DebugComparison<float,_double> *)local_510,(float *)&local_4c0,
                   (double *)&local_4e8);
      }
      bVar8 = NAN(*(double *)
                   ((long)&((WireValue<uint32_t> *)local_548._16_8_)->value +
                   ((sStack_530 >> 0x20) * 3 >> 3)));
      local_510[0] = bVar8;
      if ((!bVar8) && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x132,ERROR,"\"failed: expected \" \"isNaN(listReader[3])\", _kjCondition",
                   (char (*) [38])"failed: expected isNaN(listReader[3])",
                   (DebugExpression<bool> *)local_510);
      }
      local_548._16_8_ = in_stack_00000020 + 0xf;
      PointerBuilder::getList(&local_418,(PointerBuilder *)local_548,POINTER,(word *)0x0);
      local_548._0_8_ = "plugh";
      local_548._8_8_ = (CapTableBuilder *)0x6;
      local_548._16_8_ = "xyzzy";
      sStack_530 = 6;
      local_528 = "thud";
      sStack_520 = 5;
      reader_24.builder.capTable = local_418.capTable;
      reader_24.builder.segment = local_418.segment;
      reader_24.builder.ptr = local_418.ptr;
      reader_24.builder.elementCount = local_418.elementCount;
      reader_24.builder.step = local_418.step;
      reader_24.builder.structDataSize = local_418.structDataSize;
      reader_24.builder.structPointerCount = local_418.structPointerCount;
      reader_24.builder.elementSize = local_418.elementSize;
      reader_24.builder._39_1_ = local_418._39_1_;
      expected_23._M_len = 3;
      expected_23._M_array = (iterator)local_548;
      checkList<capnp::List<capnp::Text,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Text,_(capnp::Kind)1>,_false>
                (reader_24,expected_23);
      local_548._16_8_ = in_stack_00000020 + 0x10;
      PointerBuilder::getList(&local_440,(PointerBuilder *)local_548,POINTER,(word *)0x0);
      local_548._0_8_ = "oops";
      local_548._8_8_ = &DAT_00000004;
      local_548._16_8_ = anon_var_dwarf_ba5c8;
      sStack_530 = 9;
      local_528 = "rfc3092";
      sStack_520 = 7;
      reader_25.builder.capTable = local_440.capTable;
      reader_25.builder.segment = local_440.segment;
      reader_25.builder.ptr = local_440.ptr;
      reader_25.builder.elementCount = local_440.elementCount;
      reader_25.builder.step = local_440.step;
      reader_25.builder.structDataSize = local_440.structDataSize;
      reader_25.builder.structPointerCount = local_440.structPointerCount;
      reader_25.builder.elementSize = local_440.elementSize;
      reader_25.builder._39_1_ = local_440._39_1_;
      expected_24._M_len = 3;
      expected_24._M_array = (iterator)local_548;
      checkList<capnp::List<capnp::Data,_(capnp::Kind)1>::Builder,_capnp::List<capnp::Data,_(capnp::Kind)1>,_false>
                (reader_25,expected_24);
      local_548._16_8_ = in_stack_00000020 + 0x11;
      PointerBuilder::getStructList
                ((ListBuilder *)local_510,(PointerBuilder *)local_548,(StructSize)0x140006,
                 (word *)0x0);
      local_548._4_4_ = (ListElementCount)local_4f8;
      local_548._0_4_ = 3;
      local_548._8_8_ = " == ";
      local_548._16_8_ = &DAT_00000005;
      sStack_530 = CONCAT71(sStack_530._1_7_,(ListElementCount)local_4f8 == 3);
      if ((ListElementCount)local_4f8 != 3) {
        local_4c0.segment._0_4_ = 3;
        local_498.segment =
             (SegmentBuilder *)CONCAT44(local_498.segment._4_4_,(ListElementCount)local_4f8);
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                  ((Fault *)&local_4e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x138,FAILED,"(3u) == (listReader.size())","_kjCondition,3u, listReader.size()",
                   (DebugComparison<unsigned_int,_unsigned_int> *)local_548,(uint *)&local_4c0,
                   (uint *)&local_498);
        kj::_::Debug::Fault::fatal((Fault *)&local_4e8);
      }
      local_498.segment = (SegmentBuilder *)0x2b08da;
      ListBuilder::getStructElement((StructBuilder *)&local_4e8,(ListBuilder *)local_510,0);
      local_548._0_8_ = local_4e8.segment;
      local_548._8_8_ = local_4e8.capTable;
      PointerBuilder::getBlob<capnp::Text>
                ((Builder *)&local_4c0,(PointerBuilder *)local_548,(void *)0x0,0);
      kj::_::DebugExpression<char_const(&)[13]>::operator==
                ((DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)local_548,
                 (DebugExpression<char_const(&)[13]> *)&local_498,(Builder *)&local_4c0);
      if ((local_518 == false) && (kj::_::Debug::minSeverity < 3)) {
        ListBuilder::getStructElement((StructBuilder *)&local_4e8,(ListBuilder *)local_510,0);
        local_4c0.segment = local_4e8.segment;
        local_4c0.capTable = local_4e8.capTable;
        PointerBuilder::getBlob<capnp::Text>
                  ((Builder *)&local_498,(PointerBuilder *)&local_4c0,(void *)0x0,0);
        kj::_::Debug::
        log<char_const(&)[68],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Builder>&,char_const(&)[13],capnp::Text::Builder>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x139,ERROR,
                   "\"failed: expected \" \"(\\\"structlist 1\\\") == (listReader[0].getTextField())\", _kjCondition, \"structlist 1\", listReader[0].getTextField()"
                   ,(char (*) [68])
                    "failed: expected (\"structlist 1\") == (listReader[0].getTextField())",
                   (DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)local_548,
                   (char (*) [13])0x2b08da,(Builder *)&local_498);
      }
      local_498.segment = (SegmentBuilder *)0x2a0cc8;
      ListBuilder::getStructElement((StructBuilder *)&local_4e8,(ListBuilder *)local_510,1);
      local_548._0_8_ = local_4e8.segment;
      local_548._8_8_ = local_4e8.capTable;
      PointerBuilder::getBlob<capnp::Text>
                ((Builder *)&local_4c0,(PointerBuilder *)local_548,(void *)0x0,0);
      kj::_::DebugExpression<char_const(&)[13]>::operator==
                ((DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)local_548,
                 (DebugExpression<char_const(&)[13]> *)&local_498,(Builder *)&local_4c0);
      if ((local_518 == false) && (kj::_::Debug::minSeverity < 3)) {
        ListBuilder::getStructElement((StructBuilder *)&local_4e8,(ListBuilder *)local_510,1);
        local_4c0.segment = local_4e8.segment;
        local_4c0.capTable = local_4e8.capTable;
        PointerBuilder::getBlob<capnp::Text>
                  ((Builder *)&local_498,(PointerBuilder *)&local_4c0,(void *)0x0,0);
        kj::_::Debug::
        log<char_const(&)[68],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Builder>&,char_const(&)[13],capnp::Text::Builder>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x13a,ERROR,
                   "\"failed: expected \" \"(\\\"structlist 2\\\") == (listReader[1].getTextField())\", _kjCondition, \"structlist 2\", listReader[1].getTextField()"
                   ,(char (*) [68])
                    "failed: expected (\"structlist 2\") == (listReader[1].getTextField())",
                   (DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)local_548,
                   (char (*) [13])0x2a0cc8,(Builder *)&local_498);
      }
      local_498.segment = (SegmentBuilder *)0x2b0a9a;
      ListBuilder::getStructElement((StructBuilder *)&local_4e8,(ListBuilder *)local_510,2);
      local_548._0_8_ = local_4e8.segment;
      local_548._8_8_ = local_4e8.capTable;
      PointerBuilder::getBlob<capnp::Text>
                ((Builder *)&local_4c0,(PointerBuilder *)local_548,(void *)0x0,0);
      kj::_::DebugExpression<char_const(&)[13]>::operator==
                ((DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)local_548,
                 (DebugExpression<char_const(&)[13]> *)&local_498,(Builder *)&local_4c0);
      if ((local_518 == false) && (kj::_::Debug::minSeverity < 3)) {
        ListBuilder::getStructElement((StructBuilder *)&local_4e8,(ListBuilder *)local_510,2);
        local_4c0.segment = local_4e8.segment;
        local_4c0.capTable = local_4e8.capTable;
        PointerBuilder::getBlob<capnp::Text>
                  ((Builder *)&local_498,(PointerBuilder *)&local_4c0,(void *)0x0,0);
        kj::_::Debug::
        log<char_const(&)[68],kj::_::DebugComparison<char_const(&)[13],capnp::Text::Builder>&,char_const(&)[13],capnp::Text::Builder>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x13b,ERROR,
                   "\"failed: expected \" \"(\\\"structlist 3\\\") == (listReader[2].getTextField())\", _kjCondition, \"structlist 3\", listReader[2].getTextField()"
                   ,(char (*) [68])
                    "failed: expected (\"structlist 3\") == (listReader[2].getTextField())",
                   (DebugComparison<const_char_(&)[13],_capnp::Text::Builder> *)local_548,
                   (char (*) [13])0x2b0a9a,(Builder *)&local_498);
      }
      local_548._16_8_ = in_stack_00000020 + 0x12;
      local_548._4_4_ = uVar5;
      PointerBuilder::getList(&local_468,(PointerBuilder *)local_548,TWO_BYTES,(word *)0x0);
      local_548._0_4_ = 0x70000;
      reader_26.builder.capTable = local_468.capTable;
      reader_26.builder.segment = local_468.segment;
      reader_26.builder.ptr = local_468.ptr;
      reader_26.builder.elementCount = local_468.elementCount;
      reader_26.builder.step = local_468.step;
      reader_26.builder.structDataSize = local_468.structDataSize;
      reader_26.builder.structPointerCount = local_468.structPointerCount;
      reader_26.builder.elementSize = local_468.elementSize;
      reader_26.builder._39_1_ = local_468._39_1_;
      expected_25._M_len = 2;
      expected_25._M_array = (iterator)local_548;
      checkList<capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)0>::Builder,_capnp::List<capnp::schemas::TestEnum_9c8e9318b29d9cd3,_(capnp::Kind)2>,_false>
                (reader_26,expected_25);
      return;
    }
    local_4c0.segment._0_4_ = 4;
    local_498.segment =
         (SegmentBuilder *)CONCAT44(local_498.segment._4_4_,(ListElementCount)sStack_530);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ((Fault *)&local_4e8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x126,FAILED,"(4u) == (listReader.size())","_kjCondition,4u, listReader.size()",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_510,(uint *)&local_4c0,
               (uint *)&local_498);
    kj::_::Debug::Fault::fatal((Fault *)&local_4e8);
  }
  local_498.segment = (SegmentBuilder *)CONCAT44(local_498.segment._4_4_,3);
  local_480._0_4_ = local_4e8.elementCount;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
            ((Fault *)&local_4c0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
             ,0x111,FAILED,"(3u) == (listReader.size())","_kjCondition,3u, listReader.size()",
             (DebugComparison<unsigned_int,_unsigned_int> *)local_548,(uint *)&local_498,
             (uint *)&local_480);
  kj::_::Debug::Fault::fatal((Fault *)&local_4c0);
}

Assistant:

void genericCheckTestMessage(Reader reader) {
  EXPECT_EQ(VOID, reader.getVoidField());
  EXPECT_EQ(true, reader.getBoolField());
  EXPECT_EQ(-123, reader.getInt8Field());
  EXPECT_EQ(-12345, reader.getInt16Field());
  EXPECT_EQ(-12345678, reader.getInt32Field());
  EXPECT_EQ(-123456789012345ll, reader.getInt64Field());
  EXPECT_EQ(234u, reader.getUInt8Field());
  EXPECT_EQ(45678u, reader.getUInt16Field());
  EXPECT_EQ(3456789012u, reader.getUInt32Field());
  EXPECT_EQ(12345678901234567890ull, reader.getUInt64Field());
  EXPECT_FLOAT_EQ(1234.5f, reader.getFloat32Field());
  EXPECT_DOUBLE_EQ(-123e45, reader.getFloat64Field());
  EXPECT_EQ("foo", reader.getTextField());
  EXPECT_EQ(data("bar"), reader.getDataField());
  {
    auto subReader = reader.getStructField();
    EXPECT_EQ(VOID, subReader.getVoidField());
    EXPECT_EQ(true, subReader.getBoolField());
    EXPECT_EQ(-12, subReader.getInt8Field());
    EXPECT_EQ(3456, subReader.getInt16Field());
    EXPECT_EQ(-78901234, subReader.getInt32Field());
    EXPECT_EQ(56789012345678ll, subReader.getInt64Field());
    EXPECT_EQ(90u, subReader.getUInt8Field());
    EXPECT_EQ(1234u, subReader.getUInt16Field());
    EXPECT_EQ(56789012u, subReader.getUInt32Field());
    EXPECT_EQ(345678901234567890ull, subReader.getUInt64Field());
    EXPECT_FLOAT_EQ(-1.25e-10f, subReader.getFloat32Field());
    EXPECT_DOUBLE_EQ(345, subReader.getFloat64Field());
    EXPECT_EQ("baz", subReader.getTextField());
    EXPECT_EQ(data("qux"), subReader.getDataField());
    {
      auto subSubReader = subReader.getStructField();
      EXPECT_EQ("nested", subSubReader.getTextField());
      EXPECT_EQ("really nested", subSubReader.getStructField().getTextField());
    }
    EXPECT_EQ(TestEnum::BAZ, subReader.getEnumField());

    checkList(subReader.getVoidList(), {VOID, VOID, VOID});
    checkList(subReader.getBoolList(), {false, true, false, true, true});
    checkList(subReader.getInt8List(), {12, -34, -0x80, 0x7f});
    checkList(subReader.getInt16List(), {1234, -5678, -0x8000, 0x7fff});
    // gcc warns on -0x800... and the only work-around I could find was to do -0x7ff...-1.
    checkList(subReader.getInt32List(), {12345678, -90123456, -0x7fffffff - 1, 0x7fffffff});
    checkList(subReader.getInt64List(), {123456789012345ll, -678901234567890ll, -0x7fffffffffffffffll-1, 0x7fffffffffffffffll});
    checkList(subReader.getUInt8List(), {12u, 34u, 0u, 0xffu});
    checkList(subReader.getUInt16List(), {1234u, 5678u, 0u, 0xffffu});
    checkList(subReader.getUInt32List(), {12345678u, 90123456u, 0u, 0xffffffffu});
    checkList(subReader.getUInt64List(), {123456789012345ull, 678901234567890ull, 0ull, 0xffffffffffffffffull});
    checkList(subReader.getFloat32List(), {0.0f, 1234567.0f, 1e37f, -1e37f, 1e-37f, -1e-37f});
    checkList(subReader.getFloat64List(), {0.0, 123456789012345.0, 1e306, -1e306, 1e-306, -1e-306});
    checkList(subReader.getTextList(), {"quux", "corge", "grault"});
    checkList(subReader.getDataList(), {data("garply"), data("waldo"), data("fred")});
    {
      auto listReader = subReader.getStructList();
      ASSERT_EQ(3u, listReader.size());
      EXPECT_EQ("x structlist 1", listReader[0].getTextField());
      EXPECT_EQ("x structlist 2", listReader[1].getTextField());
      EXPECT_EQ("x structlist 3", listReader[2].getTextField());
    }
    checkList(subReader.getEnumList(), {TestEnum::QUX, TestEnum::BAR, TestEnum::GRAULT});
  }
  EXPECT_EQ(TestEnum::CORGE, reader.getEnumField());

  EXPECT_EQ(6u, reader.getVoidList().size());
  checkList(reader.getBoolList(), {true, false, false, true});
  checkList(reader.getInt8List(), {111, -111});
  checkList(reader.getInt16List(), {11111, -11111});
  checkList(reader.getInt32List(), {111111111, -111111111});
  checkList(reader.getInt64List(), {1111111111111111111ll, -1111111111111111111ll});
  checkList(reader.getUInt8List(), {111u, 222u});
  checkList(reader.getUInt16List(), {33333u, 44444u});
  checkList(reader.getUInt32List(), {3333333333u});
  checkList(reader.getUInt64List(), {11111111111111111111ull});
  {
    auto listReader = reader.getFloat32List();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(5555.5f, listReader[0]);
    EXPECT_EQ(kj::inf(), listReader[1]);
    EXPECT_EQ(-kj::inf(), listReader[2]);
    EXPECT_TRUE(isNaN(listReader[3]));
  }
  {
    auto listReader = reader.getFloat64List();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(7777.75, listReader[0]);
    EXPECT_EQ(kj::inf(), listReader[1]);
    EXPECT_EQ(-kj::inf(), listReader[2]);
    EXPECT_TRUE(isNaN(listReader[3]));
  }
  checkList(reader.getTextList(), {"plugh", "xyzzy", "thud"});
  checkList(reader.getDataList(), {data("oops"), data("exhausted"), data("rfc3092")});
  {
    auto listReader = reader.getStructList();
    ASSERT_EQ(3u, listReader.size());
    EXPECT_EQ("structlist 1", listReader[0].getTextField());
    EXPECT_EQ("structlist 2", listReader[1].getTextField());
    EXPECT_EQ("structlist 3", listReader[2].getTextField());
  }
  checkList(reader.getEnumList(), {TestEnum::FOO, TestEnum::GARPLY});
}